

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

result<long,_toml::error_info> *
toml::read_bin_int<long>
          (result<long,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  string __str;
  string __str_1;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  error_info local_158;
  source_location local_100;
  failure<toml::error_info> local_88;
  
  sVar4 = str->_M_string_length;
  if (sVar4 == 0) {
    lVar2 = 0;
    bVar9 = false;
  }
  else {
    lVar6 = 1;
    lVar2 = 0;
    do {
      lVar8 = 0;
      if ((str->_M_dataplus)._M_p[sVar4 - 1] == '1') {
        lVar8 = lVar6;
      }
      lVar2 = lVar2 + lVar8;
      lVar8 = lVar6 * 2;
      lVar7 = 0;
      if (lVar6 < 0x4000000000000000) {
        lVar7 = lVar8;
      }
      lVar6 = lVar7;
      if (sVar4 == 1) {
        lVar6 = lVar8;
      }
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    bVar9 = lVar6 == 0;
  }
  if (bVar9) {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_198,2,'-');
    pcVar1 = local_198._M_dataplus._M_p;
    pcVar1[0] = '6';
    pcVar1[1] = '3';
    pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_198,0,0,
                     "toml::parse_bin_integer: too large integer: current max value = 2^",0x42);
    local_1d8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == paVar5) {
      local_1d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_1d8._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    source_location::source_location(&local_100,src);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_178,2,'-');
    pcVar1 = local_178._M_dataplus._M_p;
    pcVar1[0] = '6';
    pcVar1[1] = '3';
    pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_178,0,0,"must be < 2^",0xc);
    local_1b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == paVar5) {
      local_1b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_1b8._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    make_error_info<>(&local_158,&local_1d8,&local_100,&local_1b8);
    err<toml::error_info>(&local_88,&local_158);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.suffix_._M_dataplus._M_p != &local_158.suffix_.field_2) {
      operator_delete(local_158.suffix_._M_dataplus._M_p,
                      local_158.suffix_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_158.locations_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.title_._M_dataplus._M_p != &local_158.title_.field_2) {
      operator_delete(local_158.title_._M_dataplus._M_p,
                      local_158.title_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    __return_storage_ptr__->is_ok_ = true;
    *(long *)&__return_storage_ptr__->field_1 = lVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_bin_int(const std::string& str, const source_location src)
{
    constexpr auto is_bounded =  std::numeric_limits<T>::is_bounded;
    constexpr auto max_digits =  std::numeric_limits<T>::digits;
    const auto max_value  = (std::numeric_limits<T>::max)();

    T val{0};
    T base{1};
    for(auto i = str.rbegin(); i != str.rend(); ++i)
    {
        const auto c = *i;
        if(c == '1')
        {
            val += base;
            // prevent `base` from overflow
            if(is_bounded && max_value / 2 < base && std::next(i) != str.rend())
            {
                base = 0;
            }
            else
            {
                base *= 2;
            }
        }
        else
        {
            assert(c == '0');

            if(is_bounded && max_value / 2 < base && std::next(i) != str.rend())
            {
                base = 0;
            }
            else
            {
                base *= 2;
            }
        }
    }
    if(base == 0)
    {
        return err(make_error_info("toml::parse_bin_integer: "
            "too large integer: current max value = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}